

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O1

int * random_num(int *a,int *b,int *c,int index)

{
  if ((index != 0) && (a = c, index != 2)) {
    a = b;
  }
  return a;
}

Assistant:

int* random_num (int* a, int* b, int* c, int index){
    switch (index) {
        case 0:
            return a;
        case 1:
            return b;
        case 2:
            return c;
    }
}